

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O3

int nghttp2_map_insert(nghttp2_map *map,nghttp2_map_key_type key,void *data)

{
  nghttp2_map_bucket *pnVar1;
  void *data_00;
  uint uVar2;
  int iVar3;
  nghttp2_map_bucket *table;
  long lVar4;
  uint32_t tablelenbits;
  ulong uVar5;
  uint32_t tablelen;
  
  if (data == (void *)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_map.c"
                  ,0xde,"int nghttp2_map_insert(nghttp2_map *, nghttp2_map_key_type, void *)");
  }
  tablelen = map->tablelen;
  tablelenbits = map->tablelenbits;
  if ((ulong)(tablelen * 3) < map->size * 4 + 4) {
    tablelen = tablelen * 2;
    table = (nghttp2_map_bucket *)nghttp2_mem_calloc(map->mem,(ulong)tablelen,0x10);
    if (table == (nghttp2_map_bucket *)0x0) {
      return -0x385;
    }
    tablelenbits = tablelenbits + 1;
    uVar2 = map->tablelen;
    if (uVar2 != 0) {
      lVar4 = 8;
      uVar5 = 0;
      do {
        pnVar1 = map->table;
        data_00 = *(void **)((long)&pnVar1->hash + lVar4);
        if (data_00 != (void *)0x0) {
          iVar3 = insert(table,tablelen,tablelenbits,*(uint32_t *)((long)pnVar1 + lVar4 + -8),
                         *(nghttp2_map_key_type *)((long)pnVar1 + lVar4 + -4),data_00);
          if (iVar3 != 0) {
            __assert_fail("0 == rv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_map.c"
                          ,0xd0,"int map_resize(nghttp2_map *, uint32_t, uint32_t)");
          }
          uVar2 = map->tablelen;
        }
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x10;
      } while (uVar5 < uVar2);
    }
    nghttp2_mem_free(map->mem,map->table);
    map->tablelen = tablelen;
    map->tablelenbits = tablelenbits;
    map->table = table;
  }
  else {
    table = map->table;
  }
  iVar3 = insert(table,tablelen,tablelenbits,key * -0x61c88647,key,data);
  if (iVar3 == 0) {
    map->size = map->size + 1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int nghttp2_map_insert(nghttp2_map *map, nghttp2_map_key_type key, void *data) {
  int rv;

  assert(data);

  /* Load factor is 0.75 */
  if ((map->size + 1) * 4 > map->tablelen * 3) {
    rv = map_resize(map, map->tablelen * 2, map->tablelenbits + 1);
    if (rv != 0) {
      return rv;
    }
  }

  rv = insert(map->table, map->tablelen, map->tablelenbits, hash(key), key,
              data);
  if (rv != 0) {
    return rv;
  }
  ++map->size;
  return 0;
}